

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

void __thiscall SQVM::Remove(SQVM *this,SQInteger n)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  uint uVar4;
  SQObjectType SVar5;
  SQObjectPtr *pSVar6;
  long *plVar7;
  SQTable *pSVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (n < 0) {
    lVar9 = this->_top;
    lVar10 = n + lVar9;
  }
  else {
    lVar9 = this->_top;
    lVar10 = n + this->_stackbase + -1;
  }
  if (lVar10 < lVar9) {
    lVar11 = lVar10 << 4;
    do {
      pSVar6 = (this->_stack)._vals;
      uVar3 = *(uint *)((long)&(pSVar6->super_SQObject)._type + lVar11);
      plVar7 = *(long **)((long)&(pSVar6->super_SQObject)._unVal + lVar11);
      lVar9 = *(long *)((long)&pSVar6[1].super_SQObject._unVal + lVar11);
      *(long *)((long)&(pSVar6->super_SQObject)._unVal + lVar11) = lVar9;
      uVar4 = *(uint *)((long)&pSVar6[1].super_SQObject._type + lVar11);
      *(uint *)((long)&(pSVar6->super_SQObject)._type + lVar11) = uVar4;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(lVar9 + 8);
        *plVar1 = *plVar1 + 1;
      }
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar1 = plVar7 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar7 + 0x10))();
        }
      }
      lVar10 = lVar10 + 1;
      lVar9 = this->_top;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < lVar9);
  }
  pSVar6 = (this->_stack)._vals;
  pSVar8 = pSVar6[lVar9].super_SQObject._unVal.pTable;
  SVar5 = pSVar6[lVar9].super_SQObject._type;
  pSVar6[lVar9].super_SQObject._type = OT_NULL;
  pSVar6[lVar9].super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar2 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 - 1;
    if (*pSVar2 == 0) {
      (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_top = this->_top + -1;
  return;
}

Assistant:

void SQVM::Remove(SQInteger n) {
    n = (n >= 0)?n + _stackbase - 1:_top + n;
    for(SQInteger i = n; i < _top; i++){
        _stack[i] = _stack[i+1];
    }
    _stack[_top].Null();
    _top--;
}